

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32(CodedInputStream *this,uint32 *value)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint8 *puVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  uint32 auStack_10 [2];
  
  puVar4 = this->buffer_;
  if ((puVar4 < this->buffer_end_) && (-1 < (char)*puVar4)) {
    *value = (int)(char)*puVar4;
    this->buffer_ = puVar4 + 1;
    return true;
  }
  pbVar6 = this->buffer_;
  pbVar3 = this->buffer_end_;
  if (((int)pbVar3 - (int)pbVar6 < 10) && ((pbVar3 <= pbVar6 || ((char)pbVar3[-1] < '\0')))) {
    bVar9 = ReadVarint64Fallback(this,(uint64 *)auStack_10);
    if (!bVar9) {
      return bVar9;
    }
    *value = auStack_10[0];
    return bVar9;
  }
  uVar5 = *pbVar6 & 0x7f;
  if ((char)*pbVar6 < '\0') {
    uVar5 = uVar5 | (pbVar6[1] & 0x7f) << 7;
    if ((char)pbVar6[1] < '\0') {
      uVar5 = uVar5 | (pbVar6[2] & 0x7f) << 0xe;
      if ((char)pbVar6[2] < '\0') {
        uVar5 = (pbVar6[3] & 0x7f) << 0x15 | uVar5;
        if ((char)pbVar6[3] < '\0') {
          uVar5 = (uint)pbVar6[4] << 0x1c | uVar5;
          if ((char)pbVar6[4] < '\0') {
            pbVar3 = pbVar6 + 6;
            if ((char)pbVar6[5] < '\0') {
              pbVar6 = pbVar6 + 10;
              lVar8 = 0;
              do {
                uVar7 = (uint)lVar8;
                if (uVar7 == 4) goto LAB_001c85c5;
                lVar1 = lVar8 + 1;
                pbVar2 = pbVar3 + lVar8;
                lVar8 = lVar1;
              } while ((char)*pbVar2 < '\0');
              pbVar6 = pbVar3 + lVar1;
LAB_001c85c5:
              bVar9 = 3 < uVar7;
            }
            else {
              bVar9 = false;
              pbVar6 = pbVar3;
            }
            if (bVar9) {
              pbVar6 = (byte *)0x0;
              goto LAB_001c8550;
            }
          }
          else {
            pbVar6 = pbVar6 + 5;
          }
        }
        else {
          pbVar6 = pbVar6 + 4;
        }
      }
      else {
        pbVar6 = pbVar6 + 3;
      }
    }
    else {
      pbVar6 = pbVar6 + 2;
    }
  }
  else {
    pbVar6 = pbVar6 + 1;
  }
  *value = uVar5;
LAB_001c8550:
  if (pbVar6 != (byte *)0x0) {
    this->buffer_ = pbVar6;
  }
  return pbVar6 != (byte *)0x0;
}

Assistant:

inline bool CodedInputStream::ReadVarint32(uint32* value) {
  if (GOOGLE_PREDICT_TRUE(buffer_ < buffer_end_) && *buffer_ < 0x80) {
    *value = *buffer_;
    Advance(1);
    return true;
  } else {
    return ReadVarint32Fallback(value);
  }
}